

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerObjectGraphDumper.cpp
# Opt level: O3

void __thiscall
Memory::RecyclerObjectGraphDumper::DumpObjectReference
          (RecyclerObjectGraphDumper *this,void *objectAddress,bool remark)

{
  Param *pPVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  void *objectAddress_00;
  char16_t *form;
  undefined8 *in_FS_OFFSET;
  
  pPVar1 = this->param;
  if (pPVar1 != (Param *)0x0) {
    if ((pPVar1->dumpRootOnly == true) &&
       ((this->recycler->collectionState).value != CollectionStateFindRoots)) {
      return;
    }
    if ((pPVar1->dumpReferenceFunc != (_func_bool_char16_ptr_void_ptr_void_ptr *)0x0) &&
       (bVar4 = (*pPVar1->dumpReferenceFunc)(this->dumpObjectName,this->dumpObject,objectAddress),
       !bVar4)) {
      return;
    }
  }
  Output::Print(L"\"");
  if (this->dumpObjectName == (char16 *)0x0) {
    objectAddress_00 = this->dumpObject;
    if (objectAddress_00 == (void *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerObjectGraphDumper.cpp"
                         ,0x5a,"(this->dumpObject != nullptr)","this->dumpObject != nullptr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar2 = 0;
      objectAddress_00 = this->dumpObject;
    }
    RecyclerObjectDumper::DumpObject
              (this->dumpObjectTypeInfo,this->dumpObjectIsArray,objectAddress_00);
  }
  else {
    Output::Print(L"%s");
  }
  form = L"\" -> \"";
  if (remark) {
    form = L"\" => \"";
  }
  Output::Print(form);
  Recycler::DumpObjectDescription(this->recycler,objectAddress);
  Output::Print(L"\"\n");
  return;
}

Assistant:

void RecyclerObjectGraphDumper::DumpObjectReference(void * objectAddress, bool remark)
{
    if (this->param == nullptr || !this->param->dumpRootOnly || recycler->collectionState == CollectionStateFindRoots)
    {
        if (this->param != nullptr && this->param->dumpReferenceFunc)
        {
            if (!this->param->dumpReferenceFunc(this->dumpObjectName, this->dumpObject, objectAddress))
                return;
        }
        Output::Print(_u("\""));
        if (this->dumpObjectName)
        {
            Output::Print(_u("%s"), this->dumpObjectName);
        }
        else
        {
            Assert(this->dumpObject != nullptr);
#ifdef PROFILE_RECYCLER_ALLOC
            RecyclerObjectDumper::DumpObject(this->dumpObjectTypeInfo, this->dumpObjectIsArray, this->dumpObject);
#else
            Output::Print(_u("Address %p"), objectAddress);
#endif
        }

        Output::Print(remark? _u("\" => \"") : _u("\" -> \""));
        recycler->DumpObjectDescription(objectAddress);

        Output::Print(_u("\"\n"));
    }
}